

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall fasttext::Model::binaryLogistic(Model *this,int32_t target,bool label,real lr)

{
  undefined1 in_DL;
  undefined4 in_ESI;
  Model *in_RDI;
  float in_XMM0_Da;
  real rVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int64_t unaff_retaddr;
  Matrix *in_stack_00000008;
  Matrix *in_stack_00000010;
  real alpha;
  real score;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  float a;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar4;
  Model *this_00;
  real in_stack_fffffffffffffffc;
  
  uVar4 = CONCAT13(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  this_00 = in_RDI;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x179c1e);
  Matrix::dotRow(in_stack_00000010,(Vector *)in_stack_00000008,unaff_retaddr);
  rVar1 = sigmoid((Model *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  (real)((ulong)in_RDI >> 0x20));
  a = in_XMM0_Da * ((float)((byte)(uVar4 >> 0x18) & 1) - rVar1);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_RDI);
  Vector::addRow((Vector *)in_stack_00000010,in_stack_00000008,unaff_retaddr,
                 in_stack_fffffffffffffffc);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x179ca7);
  Matrix::addRow((Matrix *)this_00,(Vector *)CONCAT44(in_ESI,uVar4),CONCAT44(in_XMM0_Da,rVar1),a);
  if ((uVar4 & 0x1000000) == 0) {
    auVar3._4_12_ = SUB1612(ZEXT816(0x3ff0000000000000),4);
    auVar3._0_4_ = 1.0 - rVar1;
    dVar2 = log(in_RDI,auVar3._0_8_);
    rVar1 = SUB84(dVar2,0);
  }
  else {
    dVar2 = log(in_RDI,(double)(ulong)(uint)rVar1);
    rVar1 = SUB84(dVar2,0);
  }
  return -rVar1;
}

Assistant:

real Model::binaryLogistic(int32_t target, bool label, real lr) {
	real score = sigmoid(wo_->dotRow(hidden_, target));
	real alpha = lr * (real(label) - score);
	grad_.addRow(*wo_, target, alpha);
	wo_->addRow(hidden_, target, alpha);
	if (label) {
		return -log(score);
	} else {
		return -log(1.0 - score);
	}
}